

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O3

void __thiscall QPDFArgParser::handleCompletion(QPDFArgParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_type sVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  undefined8 *puVar7;
  element_type *peVar8;
  ostream *poVar9;
  _Rb_tree_node_base *p_Var10;
  long *plVar11;
  _Rb_tree_node_base *p_Var12;
  ulong uVar13;
  bool bVar14;
  string candidate;
  string prefix;
  string extra_prefix;
  long *local_b0;
  ulong local_a8;
  long local_a0;
  undefined8 uStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  peVar8 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (*(size_t *)((long)&(peVar8->completions)._M_t._M_impl.super__Rb_tree_header + 0x20) != 0)
  goto LAB_0015fbb8;
  paVar1 = &local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)paVar1;
  if (((peVar8->bash_cur)._M_string_length == 0) && (2 < (peVar8->bash_prev)._M_string_length)) {
    pcVar2 = (peVar8->bash_prev)._M_dataplus._M_p;
    if ((*pcVar2 != '-') || (pcVar2[1] != '-')) goto LAB_0015f97c;
    sVar3 = (peVar8->bash_line)._M_string_length;
    lVar6 = sVar3 - 1;
    if (sVar3 == 0) {
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",lVar6,0);
    }
    if ((peVar8->bash_line)._M_dataplus._M_p[lVar6] != '=') goto LAB_0015f97c;
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)&peVar8->bash_prev);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
LAB_0015fa70:
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
  }
  else {
LAB_0015f97c:
    iVar5 = std::__cxx11::string::compare((char *)&peVar8->bash_prev);
    if (iVar5 == 0) {
      peVar8 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      uVar13 = (peVar8->bash_cur)._M_string_length;
      uVar4 = (peVar8->bash_line)._M_string_length;
      if (uVar13 + 1 < uVar4) {
        uVar13 = ~uVar13;
        lVar6 = uVar13 + uVar4;
        if (!CARRY8(uVar13,uVar4)) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",lVar6);
        }
        if (((peVar8->bash_line)._M_dataplus._M_p[lVar6] == '=') &&
           (lVar6 = std::__cxx11::string::rfind((char)&peVar8->bash_line,0x20), lVar6 != -1)) {
          std::__cxx11::string::substr
                    ((ulong)&local_b0,
                     (ulong)&((this->m).
                              super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->bash_line);
          if ((2 < local_a8) && (((char)*local_b0 == '-' && (*(char *)((long)local_b0 + 1) == '-')))
             ) {
            std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_b0);
            std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
          }
          goto LAB_0015fa70;
        }
      }
    }
  }
  peVar8 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar8->zsh_completion == true) && (local_90._M_string_length != 0)) {
    std::operator+(&local_70,"--",&local_90);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    local_b0 = (long *)*puVar7;
    plVar11 = puVar7 + 2;
    if (local_b0 == plVar11) {
      local_a0 = *plVar11;
      uStack_98 = puVar7[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar11;
    }
    local_a8 = puVar7[1];
    *puVar7 = plVar11;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_b0);
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    peVar8 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
  }
  insertCompletions(this,peVar8->option_table,&local_90,&local_50);
  peVar8 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar8->argc == 1) {
    insertCompletions(this,&peVar8->help_option_table,&local_90,&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  peVar8 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_0015fbb8:
  std::operator+(&local_90,&local_50,&peVar8->bash_cur);
  peVar8 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var10 = *(_Base_ptr *)((long)&(peVar8->completions)._M_t._M_impl.super__Rb_tree_header + 0x10);
  p_Var12 = &(peVar8->completions)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var10 != p_Var12) {
    do {
      if (local_90._M_string_length == 0) {
LAB_0015fc63:
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,*(char **)(p_Var10 + 1),(long)p_Var10[1]._M_parent
                           );
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      else {
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)(p_Var10 + 1));
        plVar11 = local_b0;
        if (local_a8 == local_90._M_string_length) {
          if (local_a8 == 0) {
            bVar14 = true;
          }
          else {
            iVar5 = bcmp(local_b0,local_90._M_dataplus._M_p,local_a8);
            bVar14 = iVar5 == 0;
          }
        }
        else {
          bVar14 = false;
        }
        if (plVar11 != &local_a0) {
          operator_delete(plVar11,local_a0 + 1);
        }
        if (bVar14) goto LAB_0015fc63;
      }
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != p_Var12);
  }
  exit(0);
}

Assistant:

void
QPDFArgParser::handleCompletion()
{
    std::string extra_prefix;
    if (m->completions.empty()) {
        // Detect --option=... Bash treats the = as a word separator.
        std::string choice_option;
        if (m->bash_cur.empty() && (m->bash_prev.length() > 2) && (m->bash_prev.at(0) == '-') &&
            (m->bash_prev.at(1) == '-') && (m->bash_line.at(m->bash_line.length() - 1) == '=')) {
            choice_option = m->bash_prev.substr(2, std::string::npos);
        } else if ((m->bash_prev == "=") && (m->bash_line.length() > (m->bash_cur.length() + 1))) {
            // We're sitting at --option=x. Find previous option.
            size_t end_mark = m->bash_line.length() - m->bash_cur.length() - 1;
            char before_cur = m->bash_line.at(end_mark);
            if (before_cur == '=') {
                size_t space = m->bash_line.find_last_of(' ', end_mark);
                if (space != std::string::npos) {
                    std::string candidate = m->bash_line.substr(space + 1, end_mark - space - 1);
                    if ((candidate.length() > 2) && (candidate.at(0) == '-') &&
                        (candidate.at(1) == '-')) {
                        choice_option = candidate.substr(2, std::string::npos);
                    }
                }
            }
        }
        if (m->zsh_completion && (!choice_option.empty())) {
            // zsh wants --option=choice rather than just choice
            extra_prefix = "--" + choice_option + "=";
        }
        insertCompletions(*m->option_table, choice_option, extra_prefix);
        if (m->argc == 1) {
            // Help options are valid only by themselves.
            insertCompletions(m->help_option_table, choice_option, extra_prefix);
        }
    }
    std::string prefix = extra_prefix + m->bash_cur;
    for (auto const& iter: m->completions) {
        if (prefix.empty() || (iter.substr(0, prefix.length()) == prefix)) {
            std::cout << iter << std::endl;
        }
    }
    exit(0);
}